

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-parser.h
# Opt level: O3

void ORPG::Core::permute_args(int start,int end,int opt_end,char **argv)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  
  uVar4 = ORPG::Utils::gcd(end - start,opt_end - end);
  uVar3 = (long)(opt_end - start) / (long)(int)uVar4;
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      if (0 < (int)uVar3) {
        uVar1 = uVar5 + (long)end;
        uVar6 = uVar3 & 0xffffffff;
        uVar8 = uVar1 & 0xffffffff;
        pcVar9 = argv[uVar1];
        do {
          iVar10 = opt_end - end;
          if (end <= (int)uVar8) {
            iVar10 = -(end - start);
          }
          uVar7 = (int)uVar8 + iVar10;
          uVar8 = (ulong)uVar7;
          pcVar2 = argv[(int)uVar7];
          argv[(int)uVar7] = pcVar9;
          argv[uVar1] = pcVar2;
          uVar7 = (int)uVar6 - 1;
          uVar6 = (ulong)uVar7;
          pcVar9 = pcVar2;
        } while (uVar7 != 0);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar4);
  }
  return;
}

Assistant:

static void permute_args(int start,
                                int end,
                                int opt_end,
                                char* argv[])
        {
            int cycle_start, cycle_len, cycle, nonopts, nopts, pos;
            char *swap;

            /* compute lengths of array blocks, number, size of cycles */
            nonopts = end - start;
            nopts = opt_end - end;
            cycle = ORPG::Utils::gcd(nonopts, nopts);
            cycle_len = (opt_end - start) / cycle;

            for (int i = 0; i < cycle; i++) {
                cycle_start = end + i;
                pos = cycle_start;

                for (int j = 0; j < cycle_len; j++) {
                    if (pos >= end) pos -= nonopts;
                    else            pos += nopts;

                    swap = argv[pos];
                    /* linted const cast */
                    ((char **)argv)[pos] = argv[cycle_start];

                    /* linted const cast */
                    ((char **)argv)[cycle_start] = swap;
                }
            }
        }